

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_splitor.cc
# Opt level: O2

void __thiscall xLearn::FileSpliter::split(FileSpliter *this,string *filename,int num_blocks)

{
  long lVar1;
  size_t sVar2;
  int iVar3;
  FILE *pFVar4;
  void *__dest;
  size_t sVar5;
  long lVar6;
  ostream *poVar7;
  ulong uVar8;
  string *this_00;
  size_t __len;
  allocator local_c9;
  undefined1 local_c8 [8];
  string local_c0;
  string name;
  string local_80;
  long local_60;
  uint64 local_58;
  void *local_50;
  void *local_48;
  ulong local_40;
  ulong local_38;
  
  if (filename->_M_string_length == 0) {
    local_80._M_dataplus._M_p._0_4_ = 2;
    std::__cxx11::string::string
              ((string *)&name,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/reader/file_splitor.cc"
               ,(allocator *)local_c8);
    std::__cxx11::string::string((string *)&local_c0,"split",&local_c9);
    poVar7 = Logger::Start(ERR,&name,0x29,&local_c0);
    poVar7 = std::operator<<(poVar7,"CHECK_NE failed ");
    poVar7 = std::operator<<(poVar7,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/reader/file_splitor.cc"
                            );
    poVar7 = std::operator<<(poVar7,":");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x29);
    poVar7 = std::operator<<(poVar7,"\n");
    poVar7 = std::operator<<(poVar7,"filename.empty()");
    poVar7 = std::operator<<(poVar7," = ");
    poVar7 = std::ostream::_M_insert<bool>(SUB81(poVar7,0));
    poVar7 = std::operator<<(poVar7,"\n");
    poVar7 = std::operator<<(poVar7,"true");
    poVar7 = std::operator<<(poVar7," = ");
    poVar7 = std::ostream::_M_insert<bool>(SUB81(poVar7,0));
    std::operator<<(poVar7,"\n");
  }
  else if (num_blocks < 2) {
    local_80._M_dataplus._M_p._0_4_ = 2;
    std::__cxx11::string::string
              ((string *)&name,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/reader/file_splitor.cc"
               ,(allocator *)local_c8);
    std::__cxx11::string::string((string *)&local_c0,"split",&local_c9);
    poVar7 = Logger::Start(ERR,&name,0x2a,&local_c0);
    poVar7 = std::operator<<(poVar7,"CHECK_GE failed ");
    poVar7 = std::operator<<(poVar7,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/reader/file_splitor.cc"
                            );
    poVar7 = std::operator<<(poVar7,":");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x2a);
    poVar7 = std::operator<<(poVar7,"\n");
    poVar7 = std::operator<<(poVar7,"num_blocks");
    poVar7 = std::operator<<(poVar7," = ");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,num_blocks);
    poVar7 = std::operator<<(poVar7,"\n");
    poVar7 = std::operator<<(poVar7,"2");
    poVar7 = std::operator<<(poVar7," = ");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,2);
    std::operator<<(poVar7,"\n");
  }
  else {
    pFVar4 = (FILE *)OpenFileOrDie((filename->_M_dataplus)._M_p,"r");
    iVar3 = fileno(pFVar4);
    local_60 = CONCAT44(local_60._4_4_,iVar3);
    local_58 = GetFileSize((FILE *)pFVar4);
    local_40 = (ulong)(uint)num_blocks;
    local_38 = local_58 / local_40;
    __len = (local_58 + local_38) - local_38 * local_40;
    local_48 = operator_new__(local_40 * 4);
    for (uVar8 = 0; local_40 != uVar8; uVar8 = uVar8 + 1) {
      StringPrintf_abi_cxx11_(&name,"%s_%d",(filename->_M_dataplus)._M_p,uVar8 & 0xffffffff);
      pFVar4 = (FILE *)OpenFileOrDie(name._M_dataplus._M_p,"w+");
      iVar3 = fileno(pFVar4);
      *(int *)((long)local_48 + uVar8 * 4) = iVar3;
      iVar3 = ftruncate(iVar3,__len + 0xa00000);
      if (iVar3 != 0) {
        local_c8._0_4_ = 2;
        std::__cxx11::string::string
                  ((string *)&local_c0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/reader/file_splitor.cc"
                   ,&local_c9);
        std::__cxx11::string::string((string *)&local_80,"split",(allocator *)(local_c8 + 7));
        poVar7 = Logger::Start(ERR,&local_c0,0x45,&local_80);
        poVar7 = std::operator<<(poVar7,"CHECK_EQ failed ");
        poVar7 = std::operator<<(poVar7,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/reader/file_splitor.cc"
                                );
        poVar7 = std::operator<<(poVar7,":");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x45);
        poVar7 = std::operator<<(poVar7,"\n");
        poVar7 = std::operator<<(poVar7,"ret");
        poVar7 = std::operator<<(poVar7," = ");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar3);
        poVar7 = std::operator<<(poVar7,"\n");
        poVar7 = std::operator<<(poVar7,"0");
        poVar7 = std::operator<<(poVar7," = ");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,0);
        std::operator<<(poVar7,"\n");
        std::__cxx11::string::~string((string *)&local_80);
        std::__cxx11::string::~string((string *)&local_c0);
        this_00 = (string *)local_c8;
        goto LAB_00163402;
      }
      std::__cxx11::string::~string((string *)&name);
    }
    local_50 = mmap((void *)0x0,local_58,1,2,(int)local_60,0);
    if (local_50 == (void *)0xffffffffffffffff) {
      local_80._M_dataplus._M_p._0_4_ = 2;
      std::__cxx11::string::string
                ((string *)&name,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/reader/file_splitor.cc"
                 ,(allocator *)local_c8);
      std::__cxx11::string::string((string *)&local_c0,"split",&local_c9);
      poVar7 = Logger::Start(ERR,&name,0x4d,&local_c0);
      poVar7 = std::operator<<(poVar7,"CHECK_NE failed ");
      poVar7 = std::operator<<(poVar7,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/reader/file_splitor.cc"
                              );
      poVar7 = std::operator<<(poVar7,":");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x4d);
      poVar7 = std::operator<<(poVar7,"\n");
      poVar7 = std::operator<<(poVar7,"map_ptr_read");
      poVar7 = std::operator<<(poVar7," = ");
      poVar7 = std::operator<<(poVar7,(char *)0xffffffffffffffff);
      poVar7 = std::operator<<(poVar7,"\n");
      poVar7 = std::operator<<(poVar7,"MAP_FAILED");
      poVar7 = std::operator<<(poVar7," = ");
      poVar7 = std::ostream::_M_insert<void_const*>(poVar7);
      std::operator<<(poVar7,"\n");
    }
    else {
      uVar8 = 0;
      lVar6 = 0;
      while( true ) {
        if (uVar8 == local_40) {
          munmap(local_50,local_58);
          return;
        }
        iVar3 = *(int *)((long)local_48 + uVar8 * 4);
        __dest = mmap((void *)0x0,__len,2,1,iVar3,0);
        if (__dest == (void *)0xffffffffffffffff) break;
        local_60 = lVar6;
        memcpy(__dest,(void *)((long)local_50 + lVar6),__len);
        lVar6 = __len + 1;
        sVar2 = __len;
        do {
          sVar5 = sVar2;
          lVar1 = lVar6 + -2;
          lVar6 = lVar6 + -1;
          sVar2 = sVar5 - 1;
        } while (*(char *)((long)__dest + lVar1) != '\n');
        munmap(__dest,__len);
        iVar3 = ftruncate(iVar3,lVar6);
        if (iVar3 != 0) {
          local_80._M_dataplus._M_p._0_4_ = 2;
          std::__cxx11::string::string
                    ((string *)&name,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/reader/file_splitor.cc"
                     ,(allocator *)local_c8);
          std::__cxx11::string::string((string *)&local_c0,"split",&local_c9);
          poVar7 = Logger::Start(ERR,&name,0x5e,&local_c0);
          poVar7 = std::operator<<(poVar7,"CHECK_EQ failed ");
          poVar7 = std::operator<<(poVar7,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/reader/file_splitor.cc"
                                  );
          poVar7 = std::operator<<(poVar7,":");
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x5e);
          poVar7 = std::operator<<(poVar7,"\n");
          poVar7 = std::operator<<(poVar7,"ret");
          poVar7 = std::operator<<(poVar7," = ");
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar3);
          poVar7 = std::operator<<(poVar7,"\n");
          poVar7 = std::operator<<(poVar7,"0");
          poVar7 = std::operator<<(poVar7," = ");
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,0);
          std::operator<<(poVar7,"\n");
          goto LAB_001633e9;
        }
        uVar8 = uVar8 + 1;
        lVar6 = local_60 + lVar6;
        __len = (__len + local_38) - sVar5;
      }
      local_80._M_dataplus._M_p._0_4_ = 2;
      std::__cxx11::string::string
                ((string *)&name,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/reader/file_splitor.cc"
                 ,(allocator *)local_c8);
      std::__cxx11::string::string((string *)&local_c0,"split",&local_c9);
      poVar7 = Logger::Start(ERR,&name,0x56,&local_c0);
      poVar7 = std::operator<<(poVar7,"CHECK_NE failed ");
      poVar7 = std::operator<<(poVar7,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/reader/file_splitor.cc"
                              );
      poVar7 = std::operator<<(poVar7,":");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x56);
      poVar7 = std::operator<<(poVar7,"\n");
      poVar7 = std::operator<<(poVar7,"map_ptr_write");
      poVar7 = std::operator<<(poVar7," = ");
      poVar7 = std::operator<<(poVar7,(char *)0xffffffffffffffff);
      poVar7 = std::operator<<(poVar7,"\n");
      poVar7 = std::operator<<(poVar7,"MAP_FAILED");
      poVar7 = std::operator<<(poVar7," = ");
      poVar7 = std::ostream::_M_insert<void_const*>(poVar7);
      std::operator<<(poVar7,"\n");
    }
  }
LAB_001633e9:
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&name);
  this_00 = &local_80;
LAB_00163402:
  Logger::~Logger((Logger *)this_00);
  abort();
}

Assistant:

void FileSpliter::split(const std::string& filename, int num_blocks) {
  CHECK_NE(filename.empty(), true);
  CHECK_GE(num_blocks, 2); // At least we need two blocks for CV.
  // Input
#ifndef _MSC_VER
  FILE* file_ptr_read = OpenFileOrDie(filename.c_str(), "r");
#else
  FILE* file_ptr_read = OpenFileOrDie(filename.c_str(), "rb");
#endif
  int file_desc_read = fileno(file_ptr_read);
  uint64 file_size = GetFileSize(file_ptr_read);
  uint64 average_block_size = file_size / num_blocks;
  uint64 next_block_size = average_block_size +
      file_size - (average_block_size * num_blocks);
  uint64 offset = 0;
  // Output
  FILE** file_ptr_write = new FILE* [num_blocks];
  int* file_desc_write = new int [num_blocks];

  for (int i = 0; i < num_blocks; ++i) {
    std::string name = StringPrintf("%s_%d", filename.c_str(), i);
#ifndef _MSC_VER
    file_ptr_write[i] = OpenFileOrDie(name.c_str(), "w+");
#else
    file_ptr_write[i] = OpenFileOrDie(name.c_str(), "wb+");
#endif
    file_desc_write[i] = fileno(file_ptr_write[i]);
    int ret = ftruncate(file_desc_write[i], 
      next_block_size + kMaxLineSize);
    CHECK_EQ(ret, 0);
  }
  char* map_ptr_read = (char*)mmap(NULL,
                                   file_size,
                                   PROT_READ,
                                   MAP_PRIVATE,
                                   file_desc_read,
                                   0);
  CHECK_NE(map_ptr_read, MAP_FAILED);

  for (int i = 0; i < num_blocks; ++i) {
    char* map_ptr_write = (char *)mmap(NULL,
                                       next_block_size,
                                       PROT_WRITE,
                                       MAP_SHARED,
                                       file_desc_write[i],
                                       0);
    CHECK_NE(map_ptr_write, MAP_FAILED);
    uint64 real_file_size = next_block_size;
    memcpy(map_ptr_write, map_ptr_read+offset, real_file_size);
    while (map_ptr_write[real_file_size-1] != '\n') {
      real_file_size--;
    }
    munmap(map_ptr_write, next_block_size);
    int ret = ftruncate(file_desc_write[i], real_file_size);
    CHECK_EQ(ret, 0);
    next_block_size =
        average_block_size + (next_block_size - real_file_size);
    offset += real_file_size;
#ifdef _MSC_VER
  Close(file_ptr_write[i]);
#endif
  }
  munmap(map_ptr_read, file_size);
#ifdef _MSC_VER
  Close(file_ptr_read);
#endif
}